

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkDC2(Abc_Ntk_t *pNtk,int fBalance,int fUpdateLevel,int fFanout,int fPower,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  timespec ts;
  timespec local_40;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar1 = (Abc_Ntk_t *)0x0;
    pAig = Abc_NtkToDar(pNtk,0,0);
    if (pAig != (Aig_Man_t *)0x0) {
      clock_gettime(3,&local_40);
      pMan = Dar_ManCompress2(pAig,fBalance,fUpdateLevel,fFanout,fPower,fVerbose);
      Aig_ManStop(pAig);
      pAVar1 = Abc_NtkFromDar(pNtk,pMan);
      Aig_ManStop(pMan);
    }
    return pAVar1;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x63d,"Abc_Ntk_t *Abc_NtkDC2(Abc_Ntk_t *, int, int, int, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDC2( Abc_Ntk_t * pNtk, int fBalance, int fUpdateLevel, int fFanout, int fPower, int fVerbose )
{
    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig;
    abctime clk;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
//    Aig_ManPrintStats( pMan );

clk = Abc_Clock();
    pMan = Dar_ManCompress2( pTemp = pMan, fBalance, fUpdateLevel, fFanout, fPower, fVerbose ); 
    Aig_ManStop( pTemp );
//ABC_PRT( "time", Abc_Clock() - clk );

//    Aig_ManPrintStats( pMan );
    pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}